

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O3

TestStatus *
vkt::pipeline::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict1 *caseDef)

{
  int *piVar1;
  undefined1 *puVar2;
  undefined8 *puVar3;
  VkImageViewType VVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  deUint32 dVar8;
  IVec3 renderSize;
  VkImageSubresourceRange subresourceRange;
  undefined8 uVar9;
  VkImageViewType viewType;
  VkPipelineBindPoint VVar10;
  VkDeviceSize obj;
  VkDeviceSize VVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 obj_00;
  undefined8 commandBuffer;
  void *pvVar16;
  undefined8 uVar17;
  Context *pCVar18;
  bool bVar19;
  deUint32 dVar20;
  int iVar21;
  VkResult result;
  int iVar22;
  anon_unknown_0 *this;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat format_00;
  const_iterator cVar23;
  deUint64 *pdVar24;
  VkShaderModule fragmentModule;
  VkImage *pVVar25;
  uint uVar26;
  long lVar27;
  VkDeviceSize VVar28;
  deUint32 i;
  deUint32 dVar29;
  ulong uVar30;
  long lVar31;
  VkSubpassDescription *pVVar32;
  pointer pVVar33;
  VkPrimitiveTopology attachmentCount;
  ulong uVar34;
  int iVar35;
  VkPrimitiveTopology topology;
  int iVar36;
  byte bVar37;
  undefined4 uVar38;
  undefined1 multisample;
  long *local_3e8;
  VkDeviceSize vertexBufferOffset;
  undefined1 auStack_3b0 [24];
  undefined4 uStack_398;
  undefined4 uStack_394;
  uint local_390;
  undefined4 uStack_38c;
  undefined4 local_388;
  int iStack_384;
  undefined8 uStack_380;
  deUint32 local_378;
  VkBufferCreateInfo bufferCreateInfo;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
  attachmentDescriptions;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
  colorAttachmentReferences;
  VkImage local_258;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_250;
  VkImage local_238;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_230;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  VkBuffer local_1f8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_1f0;
  Context *local_1d0;
  VkClearColorValue clearColor;
  long local_1b8 [2];
  Move<vk::Handle<(vk::HandleType)18>_> local_1a8;
  Move<vk::Handle<(vk::HandleType)13>_> local_188;
  VkImageSubresourceRange res;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_140;
  VkPipelineLayout local_128;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_120;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  TextureFormat format;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_90;
  VkShaderModule local_78;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_70;
  VkPipelineLayout local_58;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_50;
  
  bVar37 = 0;
  this = (anon_unknown_0 *)Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  dVar20 = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  DStack_250.m_device = (VkDevice)0x0;
  DStack_250.m_allocator = (VkAllocationCallbacks *)0x0;
  local_258.m_internal = 0;
  DStack_250.m_deviceIface = (DeviceInterface *)0x0;
  DStack_230.m_device = (VkDevice)0x0;
  DStack_230.m_allocator = (VkAllocationCallbacks *)0x0;
  local_238.m_internal = 0;
  DStack_230.m_deviceIface = (DeviceInterface *)0x0;
  iVar35 = (caseDef->attachmentSize).m_data[1];
  iVar22 = (caseDef->attachmentSize).m_data[0];
  iVar36 = (caseDef->attachmentSize).m_data[2];
  dVar29 = caseDef->numLayers;
  format_00 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar21 = tcu::getPixelSize(format_00);
  makeBufferCreateInfo(&bufferCreateInfo,(ulong)(iVar35 * iVar22 * iVar36 * dVar29 * iVar21),2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,
                     (DeviceInterface *)this,device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  obj = vertexBufferOffset;
  DStack_140.m_deviceIface = (DeviceInterface *)auStack_3b0._0_8_;
  DStack_140.m_device = (VkDevice)auStack_3b0._8_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
             (DeviceInterface *)this,device,allocator,(VkBuffer)vertexBufferOffset,
             (MemoryRequirement)0x1);
  uVar15 = bufferCreateInfo._0_8_;
  DStack_1f0.m_device = (VkDevice)0x0;
  DStack_1f0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_1f8.m_internal = 0;
  DStack_1f0.m_deviceIface = (DeviceInterface *)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,
                     (DeviceInterface *)this,device);
  DStack_50.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_58.m_internal = bufferCreateInfo._0_8_;
  DStack_50.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar26 = caseDef->numLayers;
  uVar34 = (ulong)uVar26;
  bVar19 = caseDef->multisample;
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            (&attachmentDescriptions,uVar34,(allocator_type *)&bufferCreateInfo);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&colorAttachmentReferences,uVar34,(allocator_type *)&bufferCreateInfo);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = context;
  if (uVar26 != 0) {
    lVar31 = 0;
    do {
      *(undefined8 *)
       ((long)&(attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_start)->flags + lVar31) = 0x2500000000;
      *(uint *)((long)&(attachmentDescriptions.
                        super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                        ._M_impl.super__Vector_impl_data._M_start)->samples + lVar31) =
           (uint)bVar19 * 3 + 1;
      puVar3 = (undefined8 *)
               ((long)&(attachmentDescriptions.
                        super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                        ._M_impl.super__Vector_impl_data._M_start)->loadOp + lVar31);
      *puVar3 = 0;
      puVar3[1] = 0x100000002;
      *(undefined8 *)
       ((long)&(attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_start)->initialLayout + lVar31) = 0x200000001;
      lVar31 = lVar31 + 0x24;
    } while (uVar34 * 0x24 != lVar31);
    lVar31 = 0;
    uVar30 = 0;
    do {
      lVar27 = (long)&(colorAttachmentReferences.
                       super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                       ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar31;
      *(int *)((long)&(colorAttachmentReferences.
                       super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                       ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar31) =
           (int)uVar30;
      *(undefined4 *)
       ((long)&(colorAttachmentReferences.
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_start)->layout + lVar31) = 2;
      bufferCreateInfo.flags = 0;
      bufferCreateInfo._20_4_ = 0;
      bufferCreateInfo.size._4_4_ = 0;
      bufferCreateInfo.queueFamilyIndexCount = 0;
      bufferCreateInfo._44_4_ = 0;
      bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
      bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferCreateInfo._4_4_ = 0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo.size._0_4_ = 1;
      bufferCreateInfo.usage = (VkBufferUsageFlags)lVar27;
      bufferCreateInfo.sharingMode = (VkSharingMode)((ulong)lVar27 >> 0x20);
      if (subpasses.
          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          subpasses.
          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        bufferCreateInfo._32_8_ = lVar27;
        std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
        _M_realloc_insert<vk::VkSubpassDescription_const&>
                  ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)
                   &subpasses,
                   (iterator)
                   subpasses.
                   super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (VkSubpassDescription *)&bufferCreateInfo);
      }
      else {
        pVVar32 = (VkSubpassDescription *)&bufferCreateInfo;
        pVVar33 = subpasses.
                  super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (lVar27 = 9; lVar27 != 0; lVar27 = lVar27 + -1) {
          VVar10 = pVVar32->pipelineBindPoint;
          pVVar33->flags = pVVar32->flags;
          pVVar33->pipelineBindPoint = VVar10;
          pVVar32 = (VkSubpassDescription *)((long)pVVar32 + (ulong)bVar37 * -0x10 + 8);
          pVVar33 = (pointer)((long)pVVar33 + (ulong)bVar37 * -0x10 + 8);
        }
        subpasses.
        super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             subpasses.
             super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar30 = uVar30 + 1;
      lVar31 = lVar31 + 8;
    } while (uVar34 != uVar30);
  }
  pCVar18 = local_1d0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = (ulong)uVar26 << 0x20;
  bufferCreateInfo.size._0_4_ =
       (int)attachmentDescriptions.
            super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bufferCreateInfo.size._4_4_ =
       (undefined4)
       ((ulong)attachmentDescriptions.
               super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
               ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  bufferCreateInfo.usage =
       (int)((ulong)((long)subpasses.
                           super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)((ulong)bufferCreateInfo.pQueueFamilyIndices._4_4_ << 0x20);
  bufferCreateInfo._40_8_ =
       subpasses.
       super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertexBufferOffset,(DeviceInterface *)this,
             device,(VkRenderPassCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  if (subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(subpasses.
                    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)subpasses.
                          super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (colorAttachmentReferences.
      super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(colorAttachmentReferences.
                    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)colorAttachmentReferences.
                          super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)colorAttachmentReferences.
                          super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (attachmentDescriptions.
      super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachmentDescriptions.
                    super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachmentDescriptions.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachmentDescriptions.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  puVar2 = auStack_3b0 + 8;
  local_128.m_internal = vertexBufferOffset;
  DStack_120.m_deviceIface = (DeviceInterface *)auStack_3b0._0_8_;
  DStack_120.m_device._0_4_ = auStack_3b0._8_4_;
  DStack_120.m_device._4_4_ = auStack_3b0._12_4_;
  DStack_120.m_allocator._0_4_ = auStack_3b0._16_4_;
  DStack_120.m_allocator._4_4_ = auStack_3b0._20_4_;
  colorAttachmentReferences.
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colorAttachmentReferences.
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  colorAttachmentReferences.
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)pCVar18->m_progCollection;
  vertexBufferOffset = (VkDeviceSize)puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vertexBufferOffset,"vert","");
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)&vertexBufferOffset);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,(DeviceInterface *)this,
             device,*(ProgramBinary **)(cVar23._M_node + 2),0);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferCreateInfo._16_8_;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)bufferCreateInfo._0_8_;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if ((undefined1 *)vertexBufferOffset != puVar2) {
    operator_delete((void *)vertexBufferOffset,(ulong)(auStack_3b0._8_8_ + 1));
  }
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)pCVar18->m_progCollection;
  vertexBufferOffset = (VkDeviceSize)puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vertexBufferOffset,"frag","");
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)&vertexBufferOffset);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,(DeviceInterface *)this,
             device,*(ProgramBinary **)(cVar23._M_node + 2),0);
  DStack_70.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(bufferCreateInfo.size._4_4_,(int)bufferCreateInfo.size);
  DStack_70.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_78.m_internal = bufferCreateInfo._0_8_;
  DStack_70.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if ((undefined1 *)vertexBufferOffset != puVar2) {
    operator_delete((void *)vertexBufferOffset,(ulong)(auStack_3b0._8_8_ + 1));
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,(DeviceInterface *)this,
             device,2,dVar20,(VkAllocationCallbacks *)0x0);
  obj_00 = bufferCreateInfo._0_8_;
  DStack_90.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(bufferCreateInfo.size._4_4_,(int)bufferCreateInfo.size);
  DStack_90.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_90.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,(DeviceInterface *)this,
                    device,(VkCommandPool)bufferCreateInfo._0_8_);
  uVar17 = bufferCreateInfo._16_8_;
  pvVar16 = bufferCreateInfo.pNext;
  commandBuffer = bufferCreateInfo._0_8_;
  uVar9 = CONCAT44(bufferCreateInfo.size._4_4_,(int)bufferCreateInfo.size);
  VVar4 = caseDef->imageType;
  viewType = VK_IMAGE_VIEW_TYPE_2D;
  if ((VVar4 != VK_IMAGE_VIEW_TYPE_CUBE) && (VVar4 != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)) {
    viewType = VVar4;
  }
  dVar29 = caseDef->numLayers;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)dVar29 < 1) {
    VVar28 = 0;
  }
  else {
    do {
      bufferCreateInfo.sType = 0xbf800000;
      bufferCreateInfo._4_4_ = 0xbf800000;
      bufferCreateInfo.pNext = (void *)0x3f80000000000000;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &attachmentDescriptions,(Vector<float,_4> *)&bufferCreateInfo);
      bufferCreateInfo.sType = 0xbf800000;
      bufferCreateInfo._4_4_ = 0x3f800000;
      bufferCreateInfo.pNext = (void *)0x3f80000000000000;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &attachmentDescriptions,(Vector<float,_4> *)&bufferCreateInfo);
      bufferCreateInfo.sType = 0x3f800000;
      bufferCreateInfo._4_4_ = 0xbf800000;
      bufferCreateInfo.pNext = (void *)0x3f80000000000000;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &attachmentDescriptions,(Vector<float,_4> *)&bufferCreateInfo);
      bufferCreateInfo.sType = 0x3f800000;
      bufferCreateInfo._4_4_ = 0x3f800000;
      bufferCreateInfo.pNext = (void *)0x3f80000000000000;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                 &attachmentDescriptions,(Vector<float,_4> *)&bufferCreateInfo);
      dVar29 = dVar29 - 1;
    } while (dVar29 != 0);
    VVar28 = (long)attachmentDescriptions.
                   super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)attachmentDescriptions.
                   super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  }
  makeBufferCreateInfo(&bufferCreateInfo,VVar28,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,
                     (DeviceInterface *)this,device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  uVar6 = auStack_3b0._8_8_;
  uVar12 = auStack_3b0._0_8_;
  VVar11 = vertexBufferOffset;
  bufferCreateInfo._16_8_ = auStack_3b0._8_8_;
  bufferCreateInfo._0_8_ = vertexBufferOffset;
  bufferCreateInfo.pNext = (void *)auStack_3b0._0_8_;
  vertexBufferOffset = 0;
  auStack_3b0._0_8_ = (DeviceInterface *)0x0;
  auStack_3b0._8_8_ = (VkDevice)0x0;
  auStack_3b0._16_4_ = 0;
  auStack_3b0._20_4_ = 0;
  if (local_1f8.m_internal == 0) {
    DStack_1f0.m_device = (VkDevice)uVar6;
    local_1f8.m_internal = VVar11;
    DStack_1f0.m_deviceIface = (DeviceInterface *)uVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_1f0,local_1f8);
    local_1f8.m_internal = bufferCreateInfo._0_8_;
    DStack_1f0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
    DStack_1f0.m_device = (VkDevice)bufferCreateInfo._16_8_;
    if (vertexBufferOffset != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)auStack_3b0,(VkBuffer)vertexBufferOffset
                );
    }
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
             (DeviceInterface *)this,device,allocator,local_1f8,(MemoryRequirement)0x1);
  uVar12 = bufferCreateInfo._0_8_;
  memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
         attachmentDescriptions.
         super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
         ._M_impl.super__Vector_impl_data._M_start,VVar28);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)this,device,(VkDeviceMemory)*(deUint64 *)(uVar12 + 8),
             *(VkDeviceSize *)(uVar12 + 0x10),VVar28);
  if (attachmentDescriptions.
      super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachmentDescriptions.
                    super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachmentDescriptions.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachmentDescriptions.
                          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar26 = 3;
  if ((ulong)caseDef->imageType < 7) {
    uVar26 = *(uint *)(&DAT_00abb290 + (ulong)caseDef->imageType * 4);
  }
  uVar6 = *(undefined8 *)(caseDef->attachmentSize).m_data;
  bufferCreateInfo.sharingMode = (caseDef->attachmentSize).m_data[2];
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = (ulong)uVar26 << 0x20;
  bufferCreateInfo.size._0_4_ = 0x25;
  bufferCreateInfo.size._4_4_ = (undefined4)uVar6;
  bufferCreateInfo.usage = (VkBufferUsageFlags)((ulong)uVar6 >> 0x20);
  bufferCreateInfo._44_4_ = caseDef->numLayers;
  bufferCreateInfo.queueFamilyIndexCount = 1;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)&DAT_00000001;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset,
                    (DeviceInterface *)this,device,(VkImageCreateInfo *)&bufferCreateInfo,
                    (VkAllocationCallbacks *)0x0);
  uVar14 = auStack_3b0._20_4_;
  uVar38 = auStack_3b0._16_4_;
  uVar7 = auStack_3b0._8_8_;
  uVar6 = auStack_3b0._0_8_;
  VVar28 = vertexBufferOffset;
  bufferCreateInfo._16_8_ = auStack_3b0._8_8_;
  bufferCreateInfo.size._0_4_ = auStack_3b0._16_4_;
  bufferCreateInfo.size._4_4_ = auStack_3b0._20_4_;
  bufferCreateInfo._0_8_ = vertexBufferOffset;
  bufferCreateInfo.pNext = (void *)auStack_3b0._0_8_;
  vertexBufferOffset = 0;
  auStack_3b0._0_8_ = (pointer)0x0;
  auStack_3b0._8_8_ = (pointer)0x0;
  auStack_3b0._16_4_ = 0;
  auStack_3b0._20_4_ = 0;
  if (local_258.m_internal == 0) {
    DStack_250.m_allocator = (VkAllocationCallbacks *)CONCAT44(uVar14,uVar38);
    DStack_250.m_device = (VkDevice)uVar7;
    local_258.m_internal = VVar28;
    DStack_250.m_deviceIface = (DeviceInterface *)uVar6;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_250,local_258);
    DStack_250.m_allocator =
         (VkAllocationCallbacks *)CONCAT44(bufferCreateInfo.size._4_4_,(int)bufferCreateInfo.size);
    local_258.m_internal = bufferCreateInfo._0_8_;
    DStack_250.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
    DStack_250.m_device = (VkDevice)bufferCreateInfo._16_8_;
    if (vertexBufferOffset != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)auStack_3b0,(VkImage)vertexBufferOffset)
      ;
    }
  }
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
            (DeviceInterface *)this,device,allocator,local_258,(MemoryRequirement)0x0);
  uVar6 = bufferCreateInfo._0_8_;
  attachmentCount = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  if (caseDef->multisample == true) {
    uVar26 = 3;
    if ((ulong)caseDef->imageType < 7) {
      uVar26 = *(uint *)(&DAT_00abb290 + (ulong)caseDef->imageType * 4);
    }
    uVar7 = *(undefined8 *)(caseDef->attachmentSize).m_data;
    bufferCreateInfo.sharingMode = (caseDef->attachmentSize).m_data[2];
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo._16_8_ = (ulong)uVar26 << 0x20;
    bufferCreateInfo.size._0_4_ = 0x25;
    bufferCreateInfo.size._4_4_ = (undefined4)uVar7;
    bufferCreateInfo.usage = (VkBufferUsageFlags)((ulong)uVar7 >> 0x20);
    bufferCreateInfo._44_4_ = caseDef->numLayers;
    bufferCreateInfo.queueFamilyIndexCount = 1;
    bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x4;
    ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset,
                      (DeviceInterface *)this,device,(VkImageCreateInfo *)&bufferCreateInfo,
                      (VkAllocationCallbacks *)0x0);
    uVar14 = auStack_3b0._20_4_;
    uVar38 = auStack_3b0._16_4_;
    uVar13 = auStack_3b0._8_8_;
    uVar7 = auStack_3b0._0_8_;
    VVar28 = vertexBufferOffset;
    bufferCreateInfo._16_8_ = auStack_3b0._8_8_;
    bufferCreateInfo.size._0_4_ = auStack_3b0._16_4_;
    bufferCreateInfo.size._4_4_ = auStack_3b0._20_4_;
    bufferCreateInfo._0_8_ = vertexBufferOffset;
    bufferCreateInfo.pNext = (void *)auStack_3b0._0_8_;
    vertexBufferOffset = 0;
    auStack_3b0._0_8_ = (pointer)0x0;
    auStack_3b0._8_8_ = (pointer)0x0;
    auStack_3b0._16_4_ = 0;
    auStack_3b0._20_4_ = 0;
    if (local_238.m_internal == 0) {
      DStack_230.m_allocator = (VkAllocationCallbacks *)CONCAT44(uVar14,uVar38);
      DStack_230.m_device = (VkDevice)uVar13;
      local_238.m_internal = VVar28;
      DStack_230.m_deviceIface = (DeviceInterface *)uVar7;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_230,local_238);
      DStack_230.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(bufferCreateInfo.size._4_4_,(int)bufferCreateInfo.size)
      ;
      local_238.m_internal = bufferCreateInfo._0_8_;
      DStack_230.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
      DStack_230.m_device = (VkDevice)bufferCreateInfo._16_8_;
      if (vertexBufferOffset != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)auStack_3b0,
                   (VkImage)vertexBufferOffset);
      }
    }
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
              (DeviceInterface *)this,device,allocator,local_238,(MemoryRequirement)0x0);
    local_3e8 = (long *)bufferCreateInfo._0_8_;
  }
  else {
    local_3e8 = (long *)0x0;
  }
  if (caseDef->numLayers != 0) {
    topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    do {
      pVVar25 = &local_258;
      if (caseDef->multisample != false) {
        pVVar25 = &local_238;
      }
      res.aspectMask = 1;
      res.baseMipLevel = 0;
      res.levelCount = 1;
      res.layerCount = 1;
      subresourceRange.levelCount = 1;
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.baseArrayLayer = topology;
      subresourceRange.layerCount = 1;
      res.baseArrayLayer = topology;
      makeImageView(&local_188,(DeviceInterface *)this,device,(VkImage)pVVar25->m_internal,viewType,
                    VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
      pdVar24 = (deUint64 *)operator_new(0x20);
      pdVar24[2] = (deUint64)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
      pdVar24[3] = (deUint64)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                   m_allocator;
      *pdVar24 = local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
      pdVar24[1] = (deUint64)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                   m_deviceIface;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo._0_8_ = pdVar24;
      bufferCreateInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
      *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00cef1b0;
      *(deUint64 **)((long)bufferCreateInfo.pNext + 0x10) = pdVar24;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
      multisample = 0xa2;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                  *)&colorAttachments,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                 &bufferCreateInfo);
      if (bufferCreateInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          bufferCreateInfo._4_4_ = 0;
          multisample = 0xcf;
          (**(code **)(*bufferCreateInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (bufferCreateInfo.pNext != (void *)0x0) {
            multisample = 0xf0;
            (**(code **)(*bufferCreateInfo.pNext + 8))();
          }
          bufferCreateInfo.pNext = (void *)0x0;
        }
      }
      if (local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
        multisample = 0x16;
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  (&local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                   (VkImageView)
                   local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
                  );
      }
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
      local_188.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      if (attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          attachmentHandles.
          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        multisample = 0x68;
        std::vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>::
        _M_realloc_insert<vk::Handle<(vk::HandleType)13>const&>
                  ((vector<vk::Handle<(vk::HandleType)13>,std::allocator<vk::Handle<(vk::HandleType)13>>>
                    *)&attachmentHandles,
                   (iterator)
                   attachmentHandles.
                   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (Handle<(vk::HandleType)13> *)
                   colorAttachments.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
      }
      else {
        (attachmentHandles.
         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->m_internal =
             ((colorAttachments.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
        attachmentHandles.
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             attachmentHandles.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      fragmentModule.m_internal._4_4_ = 0;
      fragmentModule.m_internal._0_4_ = (caseDef->renderSize).m_data[0];
      renderSize.m_data[1] = 0;
      renderSize.m_data[0] = (caseDef->renderSize).m_data[1];
      renderSize.m_data[2] = 4;
      makeGraphicsPipeline
                (&local_1a8,this,(DeviceInterface *)device,(VkDevice)local_58.m_internal,local_128,
                 (VkRenderPass)
                 subpasses.
                 super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start,local_78,fragmentModule,renderSize,
                 topology,1,caseDef->multisample,(bool)multisample);
      pdVar24 = (deUint64 *)operator_new(0x20);
      pdVar24[2] = (deUint64)
                   local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
      pdVar24[3] = (deUint64)
                   local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                   m_allocator;
      *pdVar24 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
      pdVar24[1] = (deUint64)
                   local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                   m_deviceIface;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      bufferCreateInfo.pNext = (void *)0x0;
      bufferCreateInfo._0_8_ = pdVar24;
      bufferCreateInfo.pNext = operator_new(0x20);
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
      *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00cef3f0;
      *(deUint64 **)((long)bufferCreateInfo.pNext + 0x10) = pdVar24;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
      *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                  *)&pipeline,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                 &bufferCreateInfo);
      if (bufferCreateInfo.pNext != (void *)0x0) {
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          bufferCreateInfo._4_4_ = 0;
          (**(code **)(*bufferCreateInfo.pNext + 0x10))();
        }
        LOCK();
        piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (bufferCreateInfo.pNext != (void *)0x0) {
            (**(code **)(*bufferCreateInfo.pNext + 8))();
          }
          bufferCreateInfo.pNext = (void *)0x0;
        }
      }
      if (local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                   (VkPipeline)
                   local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
                  );
      }
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
      local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      topology = topology + VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
      attachmentCount = caseDef->numLayers;
    } while (topology < attachmentCount);
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset,
                  (DeviceInterface *)this,device,(VkRenderPass)local_128.m_internal,attachmentCount,
                  attachmentHandles.
                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,(caseDef->renderSize).m_data[0],
                  (caseDef->renderSize).m_data[1],1);
  uVar13 = auStack_3b0._8_8_;
  uVar7 = auStack_3b0._0_8_;
  VVar28 = vertexBufferOffset;
  bufferCreateInfo._16_8_ = auStack_3b0._8_8_;
  bufferCreateInfo.size._0_4_ = auStack_3b0._16_4_;
  bufferCreateInfo.size._4_4_ = auStack_3b0._20_4_;
  bufferCreateInfo._0_8_ = vertexBufferOffset;
  bufferCreateInfo.pNext = (void *)auStack_3b0._0_8_;
  vertexBufferOffset = 0;
  auStack_3b0._0_8_ = (DeviceInterface *)0x0;
  auStack_3b0._8_8_ = (VkDevice)0x0;
  auStack_3b0._16_4_ = 0;
  auStack_3b0._20_4_ = 0;
  if (colorAttachmentReferences.
      super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
      _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    colorAttachmentReferences.
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar13;
    colorAttachmentReferences.
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)VVar28;
    colorAttachmentReferences.
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)uVar7;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
               &colorAttachmentReferences.
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (VkFramebuffer)
               colorAttachmentReferences.
               super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    colorAttachmentReferences.
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)bufferCreateInfo._0_8_;
    colorAttachmentReferences.
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)bufferCreateInfo.pNext;
    colorAttachmentReferences.
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferCreateInfo._16_8_;
    if (vertexBufferOffset != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)auStack_3b0,
                 (VkFramebuffer)vertexBufferOffset);
    }
  }
  beginCommandBuffer((DeviceInterface *)this,(VkCommandBuffer)commandBuffer);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0x1000;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 7;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  pVVar25 = &local_258;
  if (caseDef->multisample != false) {
    pVVar25 = &local_238;
  }
  bufferCreateInfo._40_8_ = pVVar25->m_internal;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)&DAT_00000001;
  (**(code **)(*(long *)this + 0x368))
            (this,commandBuffer,1,0x8000,0,0,0,0,0,1,(int)&bufferCreateInfo);
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000001;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(attachmentDescriptions.
                         super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,caseDef->numLayers
                        );
  clearColor._0_8_ = 0;
  clearColor._8_8_ = 0x3f80000000000000;
  pVVar25 = &local_258;
  if (caseDef->multisample != false) {
    pVVar25 = &local_238;
  }
  (**(code **)(*(long *)this + 0x330))
            (this,commandBuffer,pVVar25->m_internal,7,&clearColor,1,(int)&attachmentDescriptions);
  vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2d);
  auStack_3b0._0_8_ = (DeviceInterface *)0x0;
  auStack_3b0._8_8_ = (VkDevice)0x8000001000;
  auStack_3b0._16_4_ = 7;
  auStack_3b0._20_4_ = 1;
  uStack_398 = 0xffffffff;
  uStack_394 = 0xffffffff;
  pVVar25 = &local_258;
  if (caseDef->multisample != false) {
    pVVar25 = &local_238;
  }
  local_390 = (uint)pVVar25->m_internal;
  uStack_38c = (undefined4)(pVVar25->m_internal >> 0x20);
  local_378 = caseDef->numLayers;
  local_388 = 1;
  iStack_384 = 0;
  uStack_380 = 1;
  (**(code **)(*(long *)this + 0x368))
            (this,commandBuffer,0x1000,0x80,0,0,0,0,0,1,
             (int)(Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset);
  bufferCreateInfo.queueFamilyIndexCount = (caseDef->renderSize).m_data[0];
  bufferCreateInfo._44_4_ = (caseDef->renderSize).m_data[1];
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = local_128.m_internal;
  bufferCreateInfo.size._0_4_ =
       (int)colorAttachmentReferences.
            super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bufferCreateInfo.size._4_4_ =
       (undefined4)
       ((ulong)colorAttachmentReferences.
               super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
               ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.pQueueFamilyIndices =
       (deUint32 *)((ulong)bufferCreateInfo.pQueueFamilyIndices & 0xffffffff00000000);
  vertexBufferOffset = 0;
  (**(code **)(*(long *)this + 0x3a0))(this,commandBuffer,&bufferCreateInfo,0);
  (**(code **)(*(long *)this + 0x2c0))(this,commandBuffer,0,1,&local_1f8,&vertexBufferOffset);
  if (caseDef->numLayers != 0) {
    uVar34 = 0;
    uVar30 = 0;
    do {
      if (uVar34 != 0) {
        (**(code **)(*(long *)this + 0x3a8))(this,commandBuffer,0);
      }
      (**(code **)(*(long *)this + 0x260))
                (this,commandBuffer,0,
                 **(undefined8 **)
                   ((long)&(pipeline.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar34 * 4));
      (**(code **)(*(long *)this + 0x2c8))(this,commandBuffer,4,1,uVar34 & 0xffffffff,0);
      uVar30 = uVar30 + 1;
      uVar34 = uVar34 + 4;
    } while (uVar30 < caseDef->numLayers);
  }
  (**(code **)(*(long *)this + 0x3b0))(this,commandBuffer);
  uVar38 = SUB84(&bufferCreateInfo,0);
  if (caseDef->multisample == true) {
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo.flags = 0x100;
    bufferCreateInfo._20_4_ = 0x800;
    bufferCreateInfo.size._0_4_ = 2;
    bufferCreateInfo.size._4_4_ = 1;
    bufferCreateInfo.usage = 0xffffffff;
    bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
    bufferCreateInfo._40_8_ = local_238.m_internal;
    bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)&DAT_00000001;
    (**(code **)(*(long *)this + 0x368))(this,commandBuffer,0x8000,0x8000,0,0,0,0,0,2,uVar38);
    local_390 = caseDef->numLayers;
    auStack_3b0._0_8_ = (ulong)local_390 << 0x20;
    vertexBufferOffset = 1;
    auStack_3b0._8_8_ = (VkDevice)0x0;
    auStack_3b0._16_4_ = 0;
    auStack_3b0._20_4_ = 1;
    uStack_398 = 0;
    uStack_394 = 0;
    uStack_38c = 0;
    local_388 = 0;
    iStack_384 = 0;
    uStack_380 = *(undefined8 *)(caseDef->attachmentSize).m_data;
    local_378 = (caseDef->attachmentSize).m_data[2];
    (**(code **)(*(long *)this + 0x348))
              (this,commandBuffer,local_238.m_internal,1,local_258.m_internal,1,1,
               &vertexBufferOffset);
    uVar26 = (uint)caseDef->multisample;
  }
  else {
    uVar26 = 0;
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x100;
  if ((uVar26 & 1) != 0) {
    bufferCreateInfo.flags = 0x1000;
  }
  bufferCreateInfo._20_4_ = 0x800;
  bufferCreateInfo.size._0_4_ = 2 - (uVar26 & 1);
  bufferCreateInfo.size._4_4_ = 6;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo._40_8_ = local_258.m_internal;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)&DAT_00000001;
  (**(code **)(*(long *)this + 0x368))(this,commandBuffer,0x400,0x1000,0,0,0,0,0,1,uVar38);
  vertexBufferOffset = 0;
  auStack_3b0._0_8_ = (DeviceInterface *)0x0;
  auStack_3b0._20_4_ = caseDef->numLayers;
  auStack_3b0._16_4_ = 0;
  auStack_3b0._8_8_ = &DAT_00000001;
  uStack_398 = 0;
  uStack_394 = 0;
  local_390 = 0;
  uVar7 = *(undefined8 *)(caseDef->attachmentSize).m_data;
  iStack_384 = (caseDef->attachmentSize).m_data[2];
  uStack_38c = (undefined4)uVar7;
  local_388 = (undefined4)((ulong)uVar7 >> 0x20);
  (**(code **)(*(long *)this + 0x318))
            (this,commandBuffer,local_258.m_internal,6,obj,1,(int)&vertexBufferOffset);
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(attachmentDescriptions.
                         super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2c);
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000001000;
  (**(code **)(*(long *)this + 0x368))
            (this,commandBuffer,0x1000,0x4000,0,0,0,1,(int)&attachmentDescriptions,0,0);
  result = (**(code **)(*(long *)this + 0x250))(this,commandBuffer);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineFramebufferAttachmentTests.cpp"
                    ,0x310);
  submitCommandsAndWait((DeviceInterface *)this,device,queue,(VkCommandBuffer)commandBuffer);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)this,device,(VkDeviceMemory)*(deUint64 *)(uVar15 + 8),
             *(VkDeviceSize *)(uVar15 + 0x10),0xffffffffffffffff);
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  dVar29 = (caseDef->attachmentSize).m_data[2];
  dVar20 = caseDef->numLayers;
  if ((int)caseDef->numLayers < (int)dVar29) {
    dVar20 = dVar29;
  }
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&bufferCreateInfo,&format,(caseDef->attachmentSize).m_data[0],
             (caseDef->attachmentSize).m_data[1],dVar20);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&vertexBufferOffset,(TextureLevel *)&bufferCreateInfo);
  dVar29 = (caseDef->renderSize).m_data[2];
  dVar8 = caseDef->numLayers;
  if ((int)caseDef->numLayers < (int)dVar29) {
    dVar8 = dVar29;
  }
  if (0 < (int)auStack_3b0._8_4_) {
    iVar36 = 0;
    iVar35 = auStack_3b0._8_4_;
    iVar22 = auStack_3b0._4_4_;
    do {
      if (0 < iVar22) {
        iVar21 = 0;
        iVar35 = auStack_3b0._0_4_;
        do {
          if (0 < iVar35) {
            iVar35 = 0;
            do {
              if (((iVar35 < (caseDef->renderSize).m_data[0]) && (iVar36 < (int)dVar8)) &&
                 (iVar21 < (caseDef->renderSize).m_data[1])) {
                attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f0000003f800000;
                attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f8000003e800000;
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&vertexBufferOffset,(Vec4 *)&attachmentDescriptions,
                           iVar35,iVar21,iVar36);
              }
              else {
                attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                attachmentDescriptions.
                super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&vertexBufferOffset,(Vec4 *)&attachmentDescriptions,
                           iVar35,iVar21,iVar36);
              }
              iVar35 = iVar35 + 1;
            } while (iVar35 < (int)auStack_3b0._0_4_);
            iVar22 = auStack_3b0._4_4_;
            iVar35 = auStack_3b0._0_4_;
          }
          iVar21 = iVar21 + 1;
        } while (iVar21 < iVar22);
        iVar35 = auStack_3b0._8_4_;
      }
      iVar36 = iVar36 + 1;
    } while (iVar36 < iVar35);
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&attachmentDescriptions,&format,
             (caseDef->attachmentSize).m_data[0],(caseDef->attachmentSize).m_data[1],dVar20,
             *(void **)(uVar15 + 0x18));
  clearColor._0_8_ = 0x100000001;
  clearColor._8_8_ = 0x100000001;
  bVar19 = tcu::intThresholdCompare
                     (local_1d0->m_testCtx->m_log,"Image Comparison","",
                      (ConstPixelBufferAccess *)&vertexBufferOffset,
                      (ConstPixelBufferAccess *)&attachmentDescriptions,(UVec4 *)&clearColor,
                      COMPARE_LOG_RESULT);
  if (bVar19) {
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&bufferCreateInfo);
    bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,bufferCreateInfo._0_8_,
               (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
    if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
      operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
    }
  }
  else {
    clearColor._0_8_ = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&clearColor,"Fail","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,clearColor._0_8_,
               clearColor._8_8_ + clearColor._0_8_);
    if ((long *)clearColor._0_8_ != local_1b8) {
      operator_delete((void *)clearColor._0_8_,local_1b8[0] + 1);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&bufferCreateInfo);
  }
  if (commandBuffer != 0) {
    bufferCreateInfo._0_8_ = commandBuffer;
    (**(code **)(*pvVar16 + 0x240))(pvVar16,uVar17,uVar9,1);
  }
  if (obj_00 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_90,(VkCommandPool)obj_00);
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_70,local_78);
  }
  if (subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
               &subpasses.
                super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (VkShaderModule)
               subpasses.
               super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (colorAttachmentReferences.
      super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
               &colorAttachmentReferences.
                super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (VkFramebuffer)
               colorAttachmentReferences.
               super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_120,(VkRenderPass)local_128.m_internal);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipeline);
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_50,local_58);
  }
  if (attachmentHandles.
      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachmentHandles.
                    super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)attachmentHandles.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)attachmentHandles.
                          super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector(&colorAttachments);
  if (uVar12 != 0) {
    (**(code **)(*(long *)uVar12 + 8))(uVar12);
  }
  if (local_1f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_1f0,local_1f8);
  }
  if (uVar15 != 0) {
    (**(code **)(*(long *)uVar15 + 8))(uVar15);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_140,(VkBuffer)obj)
    ;
  }
  if (local_3e8 != (long *)0x0) {
    (**(code **)(*local_3e8 + 8))(local_3e8);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_230,local_238);
  }
  if (uVar6 != 0) {
    (**(code **)(*(long *)uVar6 + 8))(uVar6);
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_250,local_258);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	// Color image for rendering in single-sample tests or resolve target for multi-sample tests
	Move<VkImage>					colorImage;
	MovePtr<Allocation>				colorImageAlloc;

	// For multisampled tests, this is the rendering target
	Move<VkImage>					msColorImage;
	MovePtr<Allocation>				msColorImageAlloc;

	// Host memory buffer where we will copy the rendered image for verification
	const deUint32					att_size_x			= caseDef.attachmentSize.x();
	const deUint32					att_size_y			= caseDef.attachmentSize.y();
	const deUint32					att_size_z			= caseDef.attachmentSize.z();
	const VkDeviceSize				colorBufferSize		= att_size_x * att_size_y * att_size_z * caseDef.numLayers * tcu::getPixelSize(mapVkFormat(COLOR_FORMAT));
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	Move<VkBuffer>					vertexBuffer;
	MovePtr<Allocation>				vertexBufferAlloc;

	vector<SharedPtrVkImageView>	colorAttachments;
	vector<VkImageView>				attachmentHandles;

	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout(vk, device));
	vector<SharedPtrVkPipeline>		pipeline;
	const Unique<VkRenderPass>		renderPass			(makeRenderPass(vk, device, COLOR_FORMAT, caseDef.numLayers, caseDef.multisample));
	Move<VkFramebuffer>				framebuffer;

	const Unique<VkShaderModule>	vertexModule		(createShaderModule(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	fragmentModule		(createShaderModule(vk, device, context.getBinaryCollection().get("frag"), 0u));

	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));

	const VkImageViewType			imageViewType		= caseDef.imageType == VK_IMAGE_VIEW_TYPE_CUBE || caseDef.imageType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY
		? VK_IMAGE_VIEW_TYPE_2D : caseDef.imageType;

	// create vertexBuffer
	{
		const vector<tcu::Vec4>	vertices			= genFullQuadVertices(caseDef.numLayers);
		const VkDeviceSize		vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);

		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// create colorImage (and msColorImage) using the configured attachmentsize
	{
		const VkImageUsageFlags	colorImageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;

		colorImage		= makeImage(vk, device, VkImageViewCreateFlags(0), getImageType(caseDef.imageType), COLOR_FORMAT,
			caseDef.attachmentSize, caseDef.numLayers, colorImageUsage, false);
		colorImageAlloc	= bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any);

		if (caseDef.multisample)
		{
			const VkImageUsageFlags	msImageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

			msColorImage		= makeImage(vk, device, VkImageViewCreateFlags(0), getImageType(caseDef.imageType), COLOR_FORMAT,
				caseDef.attachmentSize, caseDef.numLayers, msImageUsage, true);
			msColorImageAlloc	= bindImage(vk, device, allocator, *msColorImage, MemoryRequirement::Any);
		}
	}

	// create attachmentHandles and pipelines (one for each layer). We use the renderSize for viewport and scissor
	for (deUint32 layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
	{
		colorAttachments.push_back(makeSharedPtr(makeImageView(vk, device, ! caseDef.multisample ? *colorImage : *msColorImage,
			imageViewType, COLOR_FORMAT, makeColorSubresourceRange(layerNdx, 1))));
		attachmentHandles.push_back(**colorAttachments.back());

		pipeline.push_back(makeSharedPtr(makeGraphicsPipeline(vk, device, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
			caseDef.renderSize, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, layerNdx, true, caseDef.multisample)));
	}

	// create framebuffer
	framebuffer = makeFramebuffer(vk, device, *renderPass, caseDef.numLayers, &attachmentHandles[0],
		static_cast<deUint32>(caseDef.renderSize.x()), static_cast<deUint32>(caseDef.renderSize.y()));

	// record command buffer
	beginCommandBuffer(vk, *cmdBuffer);
	{
		// Clear the entire image attachment to black
		{
			const VkImageMemoryBarrier	imageLayoutBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
					DE_NULL,											// const void*				pNext;
					0u,													// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,				// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					destQueueFamilyIndex;
					caseDef.multisample ? *msColorImage : *colorImage,	// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)		// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageLayoutBarriers);

			const VkImageSubresourceRange	ranges		= makeColorSubresourceRange(0, caseDef.numLayers);
			const VkClearColorValue			clearColor	=
	        {
                {0.0f, 0.0f, 0.0f, 1.0f}
			};
			vk.cmdClearColorImage(*cmdBuffer, caseDef.multisample ? *msColorImage : *colorImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearColor, 1u, &ranges);

			const VkImageMemoryBarrier	imageClearBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
					DE_NULL,											// const void*				pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags			srcAccessMask;
					VK_ACCESS_COLOR_ATTACHMENT_READ_BIT,				// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,				// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,							// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					destQueueFamilyIndex;
					caseDef.multisample ? *msColorImage : *colorImage,	// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)		// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageClearBarriers);
		}

		// Render pass: this should render only to the area defined by renderSize (smaller than the size of the attachment)
		{
			const VkRect2D				renderArea			=
			{
				makeOffset2D(0, 0),
				makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
			};
			const VkRenderPassBeginInfo renderPassBeginInfo =
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				0,											// uint32_t                clearValueCount;
				DE_NULL,									// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize			vertexBufferOffset	= 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
			{
				vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
				for (deUint32 layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
				{
					if (layerNdx != 0)
						vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

					vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipeline[layerNdx]);
					vk.cmdDraw(*cmdBuffer, 4u, 1u, layerNdx*4u, 0u);
				}
			}
			vk.cmdEndRenderPass(*cmdBuffer);
		}

		// If we are using a multi-sampled render target (msColorImage), resolve it now (to colorImage)
		if (caseDef.multisample)
		{
			// Transition msColorImage (from layout COLOR_ATTACHMENT_OPTIMAL) and colorImage (from layout UNDEFINED) to layout GENERAL before resolving
			const VkImageMemoryBarrier	imageBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
					DE_NULL,										// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
					*msColorImage,									// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)	// VkImageSubresourceRange	subresourceRange;
				},
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
					DE_NULL,										// const void*				pNext;
					(VkAccessFlags)0,								// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
					*colorImage,									// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)	// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 2u, imageBarriers);

			const VkImageResolve	region	=
			{
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, caseDef.numLayers),	// VkImageSubresourceLayers    srcSubresource;
				makeOffset3D(0, 0, 0),															// VkOffset3D                  srcOffset;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, caseDef.numLayers),	// VkImageSubresourceLayers    dstSubresource;
				makeOffset3D(0, 0, 0),															// VkOffset3D                  dstOffset;
				makeExtent3D(caseDef.attachmentSize)											// VkExtent3D                  extent;
			};

			vk.cmdResolveImage(*cmdBuffer, *msColorImage, VK_IMAGE_LAYOUT_GENERAL, *colorImage, VK_IMAGE_LAYOUT_GENERAL, 1, &region);
		}

		// copy colorImage to host visible colorBuffer
		{
			const VkImageMemoryBarrier	imageBarriers[]		=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,														// VkStructureType			sType;
					DE_NULL,																					// const void*				pNext;
					(vk::VkAccessFlags)(caseDef.multisample ? VK_ACCESS_TRANSFER_WRITE_BIT : VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),
					VK_ACCESS_TRANSFER_READ_BIT,																// VkAccessFlags			dstAccessMask;
					caseDef.multisample ? VK_IMAGE_LAYOUT_GENERAL : VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,														// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,																	// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,																	// deUint32					destQueueFamilyIndex;
					*colorImage,																				// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)												// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageBarriers);

			const VkBufferImageCopy		region				=
			{
				0ull,																				// VkDeviceSize                bufferOffset;
				0u,																					// uint32_t                    bufferRowLength;
				0u,																					// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, caseDef.numLayers),	// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),																// VkOffset3D                  imageOffset;
				makeExtent3D(caseDef.attachmentSize),												// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);

			const VkBufferMemoryBarrier	bufferBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}
	} // beginCommandBuffer

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
		const tcu::TextureFormat			format			= mapVkFormat(COLOR_FORMAT);
		const int							depth			= deMax32(caseDef.attachmentSize.z(), caseDef.numLayers);
		tcu::TextureLevel					textureLevel	(format, caseDef.attachmentSize.x(), caseDef.attachmentSize.y(), depth);
		const tcu::PixelBufferAccess		expectedImage	= getExpectedData(textureLevel, caseDef);
		const tcu::ConstPixelBufferAccess	resultImage		(format, caseDef.attachmentSize.x(), caseDef.attachmentSize.y(), depth, colorBufferAlloc->getHostPtr());

		if (!tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::UVec4(1), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Fail");
	}

	return tcu::TestStatus::pass("Pass");
}